

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O0

void __thiscall
dja::mat4::mat4(mat4 *this,float_t m00,float_t m01,float_t m02,float_t m03,float_t m10,float_t m11,
               float_t m12,float_t m13,float_t m20,float_t m21,float_t m22,float_t m23,float_t m30,
               float_t m31,float_t m32,float_t m33)

{
  vec4 *local_78;
  vec4 local_70;
  vec4 local_60;
  vec4 local_50;
  vec4 local_40;
  float_t local_30;
  float_t local_2c;
  float_t m13_local;
  float_t m12_local;
  float_t m11_local;
  float_t m10_local;
  float_t m03_local;
  float_t m02_local;
  float_t m01_local;
  float_t m00_local;
  mat4 *this_local;
  
  local_78 = this->m;
  local_30 = m13;
  local_2c = m12;
  m13_local = m11;
  m12_local = m10;
  m11_local = m03;
  m10_local = m02;
  m03_local = m01;
  m02_local = m00;
  _m01_local = this;
  do {
    vec4::vec4(local_78,0.0);
    local_78 = local_78 + 1;
  } while (local_78 != this[1].m);
  vec4::vec4(&local_40,m02_local,m03_local,m10_local,m11_local);
  this->m[0].x = local_40.x;
  this->m[0].y = local_40.y;
  this->m[0].z = local_40.z;
  this->m[0].w = local_40.w;
  vec4::vec4(&local_50,m12_local,m13_local,local_2c,local_30);
  this->m[1].x = local_50.x;
  this->m[1].y = local_50.y;
  this->m[1].z = local_50.z;
  this->m[1].w = local_50.w;
  vec4::vec4(&local_60,m20,m21,m22,m23);
  this->m[2].x = local_60.x;
  this->m[2].y = local_60.y;
  this->m[2].z = local_60.z;
  this->m[2].w = local_60.w;
  vec4::vec4(&local_70,m30,m31,m32,m33);
  this->m[3].x = local_70.x;
  this->m[3].y = local_70.y;
  this->m[3].z = local_70.z;
  this->m[3].w = local_70.w;
  return;
}

Assistant:

mat4::mat4(
    float_t m00, float_t m01, float_t m02, float_t m03,
    float_t m10, float_t m11, float_t m12, float_t m13,
    float_t m20, float_t m21, float_t m22, float_t m23,
    float_t m30, float_t m31, float_t m32, float_t m33
) {
    m[0] = vec4(m00, m01, m02, m03);
    m[1] = vec4(m10, m11, m12, m13);
    m[2] = vec4(m20, m21, m22, m23);
    m[3] = vec4(m30, m31, m32, m33);
}